

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O3

void __thiscall
wasm::SimplifyLocals<false,_false,_false>::visitBlock
          (SimplifyLocals<false,_false,_false> *this,Block *curr)

{
  Name *__k;
  map<wasm::Name,_std::vector<wasm::SimplifyLocals<false,_false,_false>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_false,_false>::BlockBreak>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<false,_false,_false>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_false,_false>::BlockBreak>_>_>_>_>
  *this_00;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *this_01;
  pointer pBVar1;
  pointer pBVar2;
  mapped_type *pmVar3;
  const_iterator cVar4;
  pair<std::_Rb_tree_iterator<wasm::Name>,_std::_Rb_tree_iterator<wasm::Name>_> pVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<false,_false,_false>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_false,_false>::BlockBreak>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<false,_false,_false>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_false,_false>::BlockBreak>_>_>_>_>
  pVar6;
  
  if ((curr->name).super_IString.str._M_str != (char *)0x0) {
    __k = &curr->name;
    this_00 = &this->blockBreaks;
    pmVar3 = std::
             map<wasm::Name,_std::vector<wasm::SimplifyLocals<false,_false,_false>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_false,_false>::BlockBreak>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<false,_false,_false>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_false,_false>::BlockBreak>_>_>_>_>
             ::operator[](this_00,__k);
    if ((curr->name).super_IString.str._M_str != (char *)0x0) {
      pBVar1 = (pmVar3->
               super__Vector_base<wasm::SimplifyLocals<false,_false,_false>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_false,_false>::BlockBreak>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pBVar2 = (pmVar3->
               super__Vector_base<wasm::SimplifyLocals<false,_false,_false>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_false,_false>::BlockBreak>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      this_01 = &this->unoptimizableBlocks;
      cVar4 = std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::find(&this_01->_M_t,__k);
      if ((_Rb_tree_header *)cVar4._M_node !=
          &(this->unoptimizableBlocks)._M_t._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_false,_false>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_false,_false>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_false,_false>::SinkableInfo>_>_>
        ::clear(&(this->sinkables)._M_t);
        pVar5 = std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::equal_range(&this_01->_M_t,__k);
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::_M_erase_aux(&this_01->_M_t,(_Base_ptr)pVar5.first._M_node,(_Base_ptr)pVar5.second._M_node
                      );
      }
      if (pBVar2 != pBVar1) {
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_false,_false>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_false,_false>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_false,_false>::SinkableInfo>_>_>
        ::clear(&(this->sinkables)._M_t);
        pVar6 = std::
                _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<false,_false,_false>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_false,_false>::BlockBreak>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<false,_false,_false>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_false,_false>::BlockBreak>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<false,_false,_false>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_false,_false>::BlockBreak>_>_>_>_>
                ::equal_range(&this_00->_M_t,__k);
        std::
        _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<false,_false,_false>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_false,_false>::BlockBreak>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<false,_false,_false>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_false,_false>::BlockBreak>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<false,_false,_false>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_false,_false>::BlockBreak>_>_>_>_>
        ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar6.first._M_node,(_Base_ptr)pVar6.second._M_node
                      );
        return;
      }
    }
  }
  return;
}

Assistant:

void visitBlock(Block* curr) {
    bool hasBreaks = curr->name.is() && blockBreaks[curr->name].size() > 0;

    if (allowStructure) {
      optimizeBlockReturn(curr); // can modify blockBreaks
    }

    // post-block cleanups
    if (curr->name.is()) {
      if (unoptimizableBlocks.count(curr->name)) {
        sinkables.clear();
        unoptimizableBlocks.erase(curr->name);
      }

      if (hasBreaks) {
        // more than one path to here, so nonlinear
        sinkables.clear();
        blockBreaks.erase(curr->name);
      }
    }
  }